

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase362::run(TestCase362 *this)

{
  anon_union_16_1_a8c68091_for_NullableValue<kj::StringPtr>_2 *b;
  bool bVar1;
  Input input;
  AddFailureAdapter local_58;
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:365:17)>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:367:17)>_>
  parser;
  Maybe<kj::StringPtr> result;
  
  parser.first = (Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:365:17)>
                  )0x6f6f66;
  parser.rest.first.subParser.first.expected = 'b';
  parser.rest.first.subParser.rest.first.expected = 'a';
  parser.rest.first.subParser.rest.rest.first.expected = 'r';
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "foo";
  input.end = "";
  input.best = "foo";
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_1>>
  ::operator()(&result,(OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                        *)&parser,&input);
  b = &result.ptr.field_1;
  if (result.ptr.isSet == true) {
    bVar1 = operator==("foo",&b->value);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[33],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x176,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (*s)\", \"foo\", *s",
                 (char (*) [33])"failed: expected (\"foo\") == (*s)",(char (*) [4])0x357ec7,
                 &b->value);
    }
  }
  else {
    local_58.handled = false;
    local_58.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_58.line = 0x178;
    AddFailureAdapter::operator<<(&local_58,(char (*) [26])"Expected \'foo\', got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_58);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x17a,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "bar";
  input.end = "";
  input.best = "bar";
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_1>>
  ::operator()(&result,(OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                        *)&parser,&input);
  if (result.ptr.isSet == true) {
    bVar1 = operator==("bar",&b->value);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[33],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x182,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (*s)\", \"bar\", *s",
                 (char (*) [33])"failed: expected (\"bar\") == (*s)",(char (*) [4])0x33b5a1,
                 &b->value);
    }
  }
  else {
    local_58.handled = false;
    local_58.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_58.line = 0x184;
    AddFailureAdapter::operator<<(&local_58,(char (*) [26])"Expected \'bar\', got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_58);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x186,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  return;
}

Assistant:

TEST(CommonParsers, OneOfParser) {
  auto parser = oneOf(
      transform(sequence(exactly('f'), exactly('o'), exactly('o')),
                []() -> StringPtr { return "foo"; }),
      transform(sequence(exactly('b'), exactly('a'), exactly('r')),
                []() -> StringPtr { return "bar"; }));

  {
    StringPtr text = "foo";
    Input input(text.begin(), text.end());
    Maybe<StringPtr> result = parser(input);
    KJ_IF_MAYBE(s, result) {
      EXPECT_EQ("foo", *s);
    } else {
      ADD_FAILURE() << "Expected 'foo', got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }